

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_69(QPDF *pdf,char *arg2)

{
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  undefined8 *puVar1;
  long *plVar2;
  undefined8 uVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  QPDFObjectHandle QVar8;
  QPDFWriter w;
  string outname;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  QPDF out;
  long *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  long local_d0;
  undefined8 uStack_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  undefined8 local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_50;
  QPDF local_38 [8];
  
  QPDF::setImmediateCopyFrom(SUB81(pdf,0));
  __x = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_50,__x);
  if (local_50.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_50.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar7 = 8;
    uVar5 = 0;
    do {
      QPDF::QPDF(local_38);
      QPDF::emptyPDF();
      if ((ulong)((long)local_50.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_50.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4) <= uVar5) {
        uVar3 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar5);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_50);
        _Unwind_Resume(uVar3);
      }
      local_60 = *(undefined8 *)
                  ((long)local_50.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
      local_58 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&((local_50.
                            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                            _M_impl.super__Vector_impl_data._M_start)->super_BaseHandle).obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar7)
      ;
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_58->_M_use_count = local_58->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_58->_M_use_count = local_58->_M_use_count + 1;
        }
      }
      QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_60;
      QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_38;
      QPDF::addPage(QVar8,false);
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"auto-","");
      QUtil::uint_to_string_abi_cxx11_((ulonglong)&local_c0,(int)uVar5);
      uVar6 = 0xf;
      if (local_80 != local_70) {
        uVar6 = local_70[0];
      }
      if (uVar6 < (ulong)(local_b8 + local_78)) {
        uVar6 = 0xf;
        if (local_c0 != local_b0) {
          uVar6 = local_b0[0];
        }
        if (uVar6 < (ulong)(local_b8 + local_78)) goto LAB_00130d4a;
        puVar1 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_80);
      }
      else {
LAB_00130d4a:
        puVar1 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_c0);
      }
      plVar2 = puVar1 + 2;
      if ((long *)*puVar1 == plVar2) {
        local_d0 = *plVar2;
        uStack_c8 = puVar1[3];
        local_e0 = &local_d0;
      }
      else {
        local_d0 = *plVar2;
        local_e0 = (long *)*puVar1;
      }
      local_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      *puVar1 = plVar2;
      puVar1[1] = 0;
      *(undefined1 *)plVar2 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_e0);
      local_a0 = &local_90;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_90 = *plVar4;
        lStack_88 = plVar2[3];
      }
      else {
        local_90 = *plVar4;
        local_a0 = (long *)*plVar2;
      }
      local_98 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_c0 != local_b0) {
        operator_delete(local_c0,local_b0[0] + 1);
      }
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      QPDFWriter::QPDFWriter((QPDFWriter *)&local_e0,local_38,(char *)local_a0);
      QPDFWriter::setStaticID(SUB81((QPDFWriter *)&local_e0,0));
      QPDFWriter::write();
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      QPDF::~QPDF(local_38);
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar5 < (ulong)((long)local_50.
                                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_50.
                                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_50);
  return;
}

Assistant:

static void
test_69(QPDF& pdf, char const* arg2)
{
    pdf.setImmediateCopyFrom(true);
    auto pages = pdf.getAllPages();
    for (size_t i = 0; i < pages.size(); ++i) {
        QPDF out;
        out.emptyPDF();
        out.addPage(pages.at(i), false);
        std::string outname = std::string("auto-") + QUtil::uint_to_string(i) + ".pdf";
        QPDFWriter w(out, outname.c_str());
        w.setStaticID(true);
        w.write();
    }
}